

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O0

void grid_cb(Fl_Int_Input *i,long v)

{
  Fl_Window *this;
  int minw;
  int minh;
  int iVar1;
  int maxh;
  char *__nptr;
  Fl_Window_Type *w;
  Fl_Type *p;
  int n;
  long v_local;
  Fl_Int_Input *i_local;
  
  __nptr = Fl_Input_::value((Fl_Input_ *)i);
  p._4_4_ = atoi(__nptr);
  if (p._4_4_ < 0) {
    p._4_4_ = 0;
  }
  if (v == 1) {
    gridx = p._4_4_;
    Fl_Preferences::set(&fluid_prefs,"gridx",p._4_4_);
  }
  else if (v == 2) {
    gridy = p._4_4_;
    Fl_Preferences::set(&fluid_prefs,"gridy",p._4_4_);
  }
  else if (v == 3) {
    snap = p._4_4_;
    Fl_Preferences::set(&fluid_prefs,"snap",p._4_4_);
  }
  for (w = (Fl_Window_Type *)Fl_Type::first; w != (Fl_Window_Type *)0x0;
      w = (Fl_Window_Type *)(w->super_Fl_Widget_Type).super_Fl_Type.next) {
    iVar1 = (*(w->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x21])();
    minh = gridy;
    minw = gridx;
    if (iVar1 != 0) {
      this = (Fl_Window *)(w->super_Fl_Widget_Type).o;
      iVar1 = Fl::w();
      maxh = Fl::h();
      Fl_Window::size_range(this,minw,minh,iVar1,maxh,gridx,gridy,0);
    }
  }
  return;
}

Assistant:

void grid_cb(Fl_Int_Input *i, long v) {
  int n = atoi(i->value());
  if (n < 0) n = 0;
  switch (v) {
    case 1:
      gridx = n;
      fluid_prefs.set("gridx", n);
      break;
    case 2:
      gridy = n;
      fluid_prefs.set("gridy", n);
      break;
    case 3:
      snap = n;
      fluid_prefs.set("snap", n);
      break;
  }

  // Next go through all of the windows in the project and set the
  // stepping for resizes...
  Fl_Type *p;
  Fl_Window_Type *w;

  for (p = Fl_Type::first; p; p = p->next) {
    if (p->is_window()) {
      w = (Fl_Window_Type *)p;
      ((Fl_Window *)(w->o))->size_range(gridx, gridy,
                                        Fl::w(), Fl::h(),
                                        gridx, gridy, 0);
    }
  }
}